

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

Raster * rw::d3d::rasterCreate(Raster *raster)

{
  FILE *__stream;
  char *pcVar1;
  Error local_28;
  Error _e;
  Raster *ret;
  Raster *raster_local;
  
  rasterSetFormat(raster);
  _e = (Error)raster;
  if ((raster->width == 0) || (raster->height == 0)) {
    raster->flags = raster->flags | 0x80;
    raster->stride = 0;
  }
  else if ((raster->flags & 0x80U) == 0) {
    if ((raster->type & 0xfffffffbU) != 0) {
      local_28.plugin = 0xb00;
      local_28.code = 0x8000000a;
      fprintf(_stderr,"%s:%d: ",
              "/workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d.cpp",0x22c)
      ;
      __stream = _stderr;
      pcVar1 = dbgsprint(0x8000000a);
      fprintf(__stream,"%s\n",pcVar1);
      setError(&local_28);
      return (Raster *)0x0;
    }
    _e = (Error)rasterCreateTexture(raster);
  }
  raster->originalWidth = raster->width;
  raster->originalHeight = raster->height;
  raster->originalStride = raster->stride;
  raster->originalPixels = raster->pixels;
  return (Raster *)_e;
}

Assistant:

Raster*
rasterCreate(Raster *raster)
{
	rasterSetFormat(raster);

	Raster *ret = raster;

	if(raster->width == 0 || raster->height == 0){
		raster->flags |= Raster::DONTALLOCATE;
		raster->stride = 0;
		goto ret;
	}
	if(raster->flags & Raster::DONTALLOCATE)
		goto ret;

	switch(raster->type){
	case Raster::NORMAL:
	case Raster::TEXTURE:
		ret = rasterCreateTexture(raster);
		break;

#ifdef RW_D3D9
	case Raster::CAMERATEXTURE:
		ret = rasterCreateCameraTexture(raster);
		break;
	case Raster::ZBUFFER:
		ret = rasterCreateZbuffer(raster);
		break;
	case Raster::CAMERA:
		ret = rasterCreateCamera(raster);
		break;
#endif

	default:
		RWERROR((ERR_INVRASTER));
		return nil;
	}

ret:
	raster->originalWidth = raster->width;
	raster->originalHeight = raster->height;
	raster->originalStride = raster->stride;
	raster->originalPixels = raster->pixels;
	return ret;
}